

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

wchar_t sg_append_buffer(sg_buffer buf_id,sg_range *data)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  _sg_buffer_t *buf_00;
  wchar_t copied_num_bytes;
  int start_pos;
  wchar_t result;
  _sg_buffer_t *buf;
  sg_range *data_local;
  sg_buffer buf_id_local;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x40b6,"int sg_append_buffer(sg_buffer, const sg_range *)");
  }
  if ((data != (sg_range *)0x0) && (data->ptr != (void *)0x0)) {
    buf_00 = _sg_lookup_buffer(&_sg.pools,buf_id.id);
    if (buf_00 == (_sg_buffer_t *)0x0) {
      copied_num_bytes = L'\0';
    }
    else {
      if ((buf_00->cmn).append_frame_index != _sg.frame_index) {
        (buf_00->cmn).append_pos = L'\0';
        (buf_00->cmn).append_overflow = false;
      }
      wVar3 = (buf_00->cmn).append_pos;
      wVar2 = _sg_roundup((wchar_t)data->size,L'\x04');
      if ((buf_00->cmn).size < wVar3 + wVar2) {
        (buf_00->cmn).append_overflow = true;
      }
      copied_num_bytes = (buf_00->cmn).append_pos;
      if (((((buf_00->slot).state == SG_RESOURCESTATE_VALID) &&
           (_Var1 = _sg_validate_append_buffer(buf_00,data), _Var1)) &&
          (((buf_00->cmn).append_overflow & 1U) == 0)) && (data->size != 0)) {
        if ((buf_00->cmn).update_frame_index == _sg.frame_index) {
          __assert_fail("buf->cmn.update_frame_index != _sg.frame_index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                        ,0x40c8,"int sg_append_buffer(sg_buffer, const sg_range *)");
        }
        wVar3 = _sg_append_buffer(buf_00,data,(buf_00->cmn).append_frame_index != _sg.frame_index);
        (buf_00->cmn).append_pos = wVar3 + (buf_00->cmn).append_pos;
        (buf_00->cmn).append_frame_index = _sg.frame_index;
      }
    }
    return copied_num_bytes;
  }
  __assert_fail("data && data->ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                ,0x40b7,"int sg_append_buffer(sg_buffer, const sg_range *)");
}

Assistant:

inline int sg_append_buffer(sg_buffer buf_id, const sg_range& data) { return sg_append_buffer(buf_id, &data); }